

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

_Bool X86_insn_reg_intel2(uint id,x86_reg *reg1,x86_reg *reg2)

{
  x86_reg xVar1;
  insn_reg2 *piVar2;
  ulong uVar3;
  insn_reg2 *piVar4;
  ulong uVar5;
  
  piVar2 = insn_regs_intel2;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    piVar4 = piVar2;
    if (uVar5 == 6) goto LAB_001a218b;
    piVar2 = piVar4 + 1;
    uVar3 = uVar5 + 1;
  } while (piVar4->insn != id);
  xVar1 = piVar4->reg2;
  *reg1 = piVar4->reg1;
  *reg2 = xVar1;
LAB_001a218b:
  return uVar5 < 6;
}

Assistant:

bool X86_insn_reg_intel2(unsigned int id, x86_reg *reg1, x86_reg *reg2)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel2); i++) {
		if (insn_regs_intel2[i].insn == id) {
			*reg1 = insn_regs_intel2[i].reg1;
			*reg2 = insn_regs_intel2[i].reg2;
			return true;
		}
	}

	// not found
	return false;
}